

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.cpp
# Opt level: O0

bool __thiscall MeCab::Viterbi::analyze(Viterbi *this,Lattice *lattice)

{
  undefined1 uVar1;
  long lVar2;
  ulong uVar3;
  long *in_RSI;
  Lattice *in_RDI;
  bool result;
  Lattice *in_stack_00000038;
  Lattice *in_stack_000000b0;
  Viterbi *in_stack_000000b8;
  Lattice *in_stack_000001a8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar4;
  
  if ((in_RSI == (long *)0x0) || (lVar2 = (**(code **)(*in_RSI + 0x40))(), lVar2 == 0)) {
    bVar4 = false;
  }
  else {
    bVar4 = initPartial(in_stack_000001a8);
    if (bVar4) {
      uVar3 = (**(code **)(*in_RSI + 0x90))(in_RSI,2);
      if (((uVar3 & 1) == 0) && (uVar3 = (**(code **)(*in_RSI + 0x90))(in_RSI,8), (uVar3 & 1) == 0))
      {
        uVar3 = (**(code **)(*in_RSI + 0xf0))();
        if ((uVar3 & 1) == 0) {
          uVar1 = viterbi<false,false>(in_stack_000000b8,in_stack_000000b0);
        }
        else {
          uVar1 = viterbi<false,true>(in_stack_000000b8,in_stack_000000b0);
        }
      }
      else {
        uVar3 = (**(code **)(*in_RSI + 0xf0))();
        if ((uVar3 & 1) == 0) {
          uVar1 = viterbi<true,false>(in_stack_000000b8,in_stack_000000b0);
        }
        else {
          uVar1 = viterbi<true,true>(in_stack_000000b8,in_stack_000000b0);
        }
      }
      if ((bool)uVar1 == false) {
        bVar4 = false;
      }
      else {
        bVar4 = forwardbackward(in_stack_00000038);
        if (bVar4) {
          bVar4 = buildBestLattice((Lattice *)CONCAT17(uVar1,in_stack_ffffffffffffffe0));
          if (bVar4) {
            bVar4 = buildAllLattice((Lattice *)
                                    CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
            if (bVar4) {
              bVar4 = initNBest(in_RDI);
              if (bVar4) {
                bVar4 = true;
              }
              else {
                bVar4 = false;
              }
            }
            else {
              bVar4 = false;
            }
          }
          else {
            bVar4 = false;
          }
        }
        else {
          bVar4 = false;
        }
      }
    }
    else {
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool Viterbi::analyze(Lattice *lattice) const {
  if (!lattice || !lattice->sentence()) {
    return false;
  }

  if (!initPartial(lattice)) {
    return false;
  }

  bool result = false;
  if (lattice->has_request_type(MECAB_NBEST) ||
      lattice->has_request_type(MECAB_MARGINAL_PROB)) {
    // IsAllPath=true
    if (lattice->has_constraint()) {
      result = viterbi<true, true>(lattice);
    } else {
      result = viterbi<true, false>(lattice);
    }
  } else {
    // IsAllPath=false
    if (lattice->has_constraint()) {
      result = viterbi<false, true>(lattice);
    } else {
      result = viterbi<false, false>(lattice);
    }
    }

  if (!result) {
    return false;
  }

  if (!forwardbackward(lattice)) {
    return false;
  }

  if (!buildBestLattice(lattice)) {
    return false;
  }

  if (!buildAllLattice(lattice)) {
    return false;
  }

  if (!initNBest(lattice)) {
    return false;
  }

  return true;
}